

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daily_file_sink.h
# Opt level: O2

filename_t *
spdlog::sinks::daily_filename_calculator::calc_filename
          (filename_t *__return_storage_ptr__,filename_t *filename,tm *now_tm)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  filename_t ext;
  filename_t basename;
  undefined1 *local_88;
  filename_t *local_80;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pointer local_38;
  size_type sStack_30;
  
  basename._M_dataplus._M_p = (pointer)&basename.field_2;
  basename._M_string_length = 0;
  basename.field_2._M_local_buf[0] = '\0';
  ext._M_dataplus._M_p = (pointer)&ext.field_2;
  ext._M_string_length = 0;
  ext.field_2._M_local_buf[0] = '\0';
  details::file_helper::split_by_extension
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_78,filename);
  local_80 = &basename;
  local_88 = (undefined1 *)&ext;
  std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
            ((tuple<std::__cxx11::string&,std::__cxx11::string&> *)&local_88,
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_78);
  std::
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Tuple_impl(&local_78);
  local_78.
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl.field_2._M_allocated_capacity = (size_type)(now_tm->tm_year + 0x76c);
  local_78.
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p = (pointer)(ulong)(now_tm->tm_mon + 1);
  local_78.
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl.field_2._M_allocated_capacity = (size_type)(uint)now_tm->tm_mday;
  local_78.
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_dataplus._M_p = basename._M_dataplus._M_p;
  local_78.
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  ._M_head_impl._M_string_length = basename._M_string_length;
  local_38 = ext._M_dataplus._M_p;
  sStack_30 = ext._M_string_length;
  fmt.size_ = 0xd111d;
  fmt.data_ = (char *)0x19;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_78;
  ::fmt::v8::vformat_abi_cxx11_(__return_storage_ptr__,(v8 *)"{}_{:04d}-{:02d}-{:02d}{}",fmt,args);
  std::__cxx11::string::~string((string *)&ext);
  std::__cxx11::string::~string((string *)&basename);
  return __return_storage_ptr__;
}

Assistant:

static filename_t calc_filename(const filename_t &filename, const tm &now_tm)
    {
        filename_t basename, ext;
        std::tie(basename, ext) = details::file_helper::split_by_extension(filename);
        return fmt_lib::format(SPDLOG_FMT_STRING(SPDLOG_FILENAME_T("{}_{:04d}-{:02d}-{:02d}{}")), basename, now_tm.tm_year + 1900,
            now_tm.tm_mon + 1, now_tm.tm_mday, ext);
    }